

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_clrsb_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  TCGv_i64 ret_00;
  uintptr_t o;
  
  ts = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)ts - (long)tcg_ctx);
  tcg_gen_sari_i64_arm(tcg_ctx,ret_00,arg,0x3f);
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_xor_i64);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)ts;
  pTVar1->args[2] = (TCGArg)(arg + (long)tcg_ctx);
  tcg_gen_clzi_i64_arm(tcg_ctx,ret_00,ret_00,0x40);
  tcg_gen_subi_i64_arm(tcg_ctx,ret,ret_00,1);
  tcg_temp_free_internal_arm(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_clrsb_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg)
{
#if TCG_TARGET_HAS_clz_i64 || TCG_TARGET_HAS_clz_i32
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_sari_i64(tcg_ctx, t, arg, 63);
        tcg_gen_xor_i64(tcg_ctx, t, t, arg);
        tcg_gen_clzi_i64(tcg_ctx, t, t, 64);
        tcg_gen_subi_i64(tcg_ctx, ret, t, 1);
        tcg_temp_free_i64(tcg_ctx, t);
#else
        gen_helper_clrsb_i64(tcg_ctx, ret, arg);
#endif
}